

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_image.h
# Opt level: O1

void __thiscall TextureImage::Texture::clear(Texture *this)

{
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  this->available = false;
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  std::__cxx11::string::operator=((string *)&this->name,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  local_30 = 0;
  local_28 = 0;
  local_38 = &local_28;
  std::__cxx11::string::operator=((string *)&this->filename,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
  }
  glDeleteTextures(1,&this->tex);
  this->tex = 0;
  return;
}

Assistant:

void clear() {
            available = false;
            name = std::string();
            filename = std::string();
            glDeleteTextures(1, &tex);
            tex = 0;
        }